

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall RTree_node::~RTree_node(RTree_node *this)

{
  RTree_node *this_00;
  Polygon *pPVar1;
  reference pvVar2;
  reference pvVar3;
  int local_18;
  int local_14;
  int i_1;
  int i;
  RTree_node *this_local;
  
  if ((this->is_leaf & 1U) == 0) {
    for (local_14 = 0; local_14 < this->elements; local_14 = local_14 + 1) {
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&this->data_internal_node,(long)local_14);
      this_00 = pvVar2->child;
      if (this_00 != (RTree_node *)0x0) {
        ~RTree_node(this_00);
        operator_delete(this_00,0x48);
      }
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&this->data_internal_node,(long)local_14);
      pvVar2->child = (RTree_node *)0x0;
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&this->data_internal_node,(long)local_14);
      pPVar1 = pvVar2->region;
      if (pPVar1 != (Polygon *)0x0) {
        Polygon::~Polygon(pPVar1);
        operator_delete(pPVar1,0x38);
      }
      pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&this->data_internal_node,(long)local_14);
      pvVar2->region = (Polygon *)0x0;
    }
  }
  else {
    for (local_18 = 0; local_18 < this->elements; local_18 = local_18 + 1) {
      pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                         (&this->data_leafs,(long)local_18);
      if (pvVar3->polygon != (Polygon *)0x0) {
        pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                           (&this->data_leafs,(long)local_18);
        pPVar1 = pvVar3->polygon;
        if (pPVar1 != (Polygon *)0x0) {
          Polygon::~Polygon(pPVar1);
          operator_delete(pPVar1,0x38);
        }
        pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                           (&this->data_leafs,(long)local_18);
        pvVar3->polygon = (Polygon *)0x0;
        pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                           (&this->data_leafs,(long)local_18);
        pPVar1 = pvVar3->region;
        if (pPVar1 != (Polygon *)0x0) {
          Polygon::~Polygon(pPVar1);
          operator_delete(pPVar1,0x38);
        }
        pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                           (&this->data_leafs,(long)local_18);
        pvVar3->region = (Polygon *)0x0;
      }
    }
  }
  std::vector<d_internal_node,_std::allocator<d_internal_node>_>::~vector(&this->data_internal_node)
  ;
  std::vector<d_leaf,_std::allocator<d_leaf>_>::~vector(&this->data_leafs);
  return;
}

Assistant:

RTree_node::~RTree_node(){
    if(!this->is_leaf){
        for(int i = 0; i < this->elements; i++){
            delete this->data_internal_node[i].child;
            this->data_internal_node[i].child = nullptr;
            delete this->data_internal_node[i].region;
            this->data_internal_node[i].region = nullptr;
        }
    }
    else{
        for(int i = 0; i < this->elements; i++){
            if(this->data_leafs[i].polygon!=nullptr){
                delete this->data_leafs[i].polygon;
                this->data_leafs[i].polygon = nullptr;
                delete this->data_leafs[i].region;
                this->data_leafs[i].region = nullptr;
            }
        }
    }
}